

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O3

int __thiscall
stackjit::ClassMetadata::getVirtualFunctionIndex(ClassMetadata *this,FunctionDefinition *funcDef)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  FunctionDefinition *function;
  string *psVar4;
  const_iterator cVar5;
  runtime_error *this_00;
  long *plVar6;
  size_type *psVar7;
  string signature;
  FunctionSignature local_d0;
  key_type local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  function = getVirtualFunctionRootDefinition(this,funcDef);
  FunctionSignature::from(&local_d0,function);
  psVar4 = FunctionSignature::str_abi_cxx11_(&local_d0);
  pcVar3 = (psVar4->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar3,pcVar3 + psVar4->_M_string_length);
  paVar1 = &local_d0.mSignature.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.mSignature._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.mSignature._M_dataplus._M_p);
  }
  cVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->mVirtualFunctionToIndex)._M_h,&local_b0);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
      ._M_cur != (__node_type *)0x0) {
    cVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->mVirtualFunctionToIndex)._M_h,&local_b0);
    if (cVar5.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
        ._M_cur != (__node_type *)0x0) {
      iVar2 = *(int *)((long)cVar5.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                             ._M_cur + 0x28);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      return iVar2;
    }
    std::__throw_out_of_range("_Map_base::at");
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_70,"There exists no virtual function \'",&local_b0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_90._M_dataplus._M_p = (pointer)*plVar6;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_90._M_dataplus._M_p == psVar7) {
    local_90.field_2._M_allocated_capacity = *psVar7;
    local_90.field_2._8_8_ = plVar6[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar7;
  }
  local_90._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::operator+(&local_50,&local_90,&this->mName);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_d0.mSignature._M_dataplus._M_p = (pointer)*plVar6;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_d0.mSignature._M_dataplus._M_p == psVar7) {
    local_d0.mSignature.field_2._M_allocated_capacity = *psVar7;
    local_d0.mSignature.field_2._8_8_ = plVar6[3];
    local_d0.mSignature._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d0.mSignature.field_2._M_allocated_capacity = *psVar7;
  }
  local_d0.mSignature._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_d0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int ClassMetadata::getVirtualFunctionIndex(const FunctionDefinition& funcDef) const {
		auto rootDef = getVirtualFunctionRootDefinition(&funcDef);
		auto signature = FunctionSignature::from(*rootDef).str();
		if (mVirtualFunctionToIndex.count(signature) == 0) {
			throw std::runtime_error("There exists no virtual function '" + signature + "' in the class '" + mName + "'.");
		}

		return mVirtualFunctionToIndex.at(signature);
	}